

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

undefined8 __thiscall
cnn::ParameterNode::as_string
          (ParameterNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  ostringstream local_190 [400];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"parameters(");
  poVar1 = cnn::operator<<(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(void **)(in_RSI + 0x78));
  std::operator<<(poVar1,')');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

string ParameterNode::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "parameters(" << dim << ", " << params << ')';
  return s.str();
}